

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

RepeatedFieldRef<google::protobuf::Message,_void> * __thiscall
google::protobuf::Reflection::GetRepeatedFieldRef<google::protobuf::Message>
          (RepeatedFieldRef<google::protobuf::Message,_void> *__return_storage_ptr__,
          Reflection *this,Message *message,FieldDescriptor *field)

{
  Reflection **v1;
  Reflection **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_50;
  Voidify local_39;
  Reflection *local_38;
  Reflection *local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  local_30 = Message::GetReflection(message);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Reflection_const*>
                 (&local_30);
  local_38 = this;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Reflection_const*>
                 (&local_38);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                       (v1,v2,"message.GetReflection() == this");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x715,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
            (__return_storage_ptr__,(MakeDependent<google::protobuf::Message,_Message> *)field_local
             ,(FieldDescriptor *)absl_log_internal_check_op_result);
  return __return_storage_ptr__;
}

Assistant:

RepeatedFieldRef<T> Reflection::GetRepeatedFieldRef(
    const Message& message, const FieldDescriptor* field) const {
  ABSL_DCHECK_EQ(message.GetReflection(), this);
  return RepeatedFieldRef<T>(message, field);
}